

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O2

void __thiscall
InstantiateConcreteMustFail_Test6_Test::TestBody(InstantiateConcreteMustFail_Test6_Test *this)

{
  char *in_R9;
  AssertHelper local_190;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  undefined1 local_180 [16];
  AssertionResult gtest_ar_;
  string local_160;
  Container ioc;
  
  Infector::Container::Container(&ioc);
  Infector::Container::bindAs<ComfortableBed,IBed>(&ioc);
  Infector::Container::wire<ComfortableBed>(&ioc);
  Infector::Container::build<IBed>((Container *)(local_180 + 8));
  Infector::Container::build<ComfortableBed>((Container *)local_180);
  if ((__buckets_ptr)local_180._0_8_ != (__buckets_ptr)0x0) {
    (*(code *)(*(__node_base_ptr *)local_180._0_8_)[2]._M_nxt)();
  }
  local_180._0_8_ = (__buckets_ptr)0x0;
  gtest_ar_.success_ = false;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::Message::Message((Message *)&local_188);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_160,(internal *)&gtest_ar_,(AssertionResult *)"testPass","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_190,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ViteFalcon[P]infectorpp/tests/UnitTest.cpp"
             ,0x1b7,local_160._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_188);
  testing::internal::AssertHelper::~AssertHelper(&local_190);
  std::__cxx11::string::~string((string *)&local_160);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_188);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  if ((long *)local_180._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_180._8_8_ + 0x10))();
  }
  Infector::Container::~Container(&ioc);
  return;
}

Assistant:

TEST(InstantiateConcreteMustFail, Test6){
    Infector::Container ioc;

    ioc.bindAs<ComfortableBed,  IBed>();

    ioc.wire<ComfortableBed>();

    auto bed = ioc.build<IBed>();
    bool testPass = false;
    try{
        ioc.build<ComfortableBed>();
    }
    catch(std::exception &ex){
        std::cout<<"ex 1"<<std::endl;
        std::cout<<ex.what()<<std::endl;
        testPass=true;
    }

    EXPECT_TRUE(testPass);
}